

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-test.c
# Opt level: O0

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  ulong uVar1;
  atf_error_t ec_4;
  atf_error_t ec_3;
  atf_error_t ec_2;
  atf_error_t ec_1;
  atf_error_t ec;
  atf_tp_t *tp_local;
  
  tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_atf__environment);
  uVar1 = atf_is_error(tp_local);
  if ((uVar1 & 1) == 0) {
    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_atf__timeout);
    uVar1 = atf_is_error(tp_local);
    if ((uVar1 & 1) == 0) {
      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_atf__checkfail);
      uVar1 = atf_is_error(tp_local);
      if ((uVar1 & 1) == 0) {
        tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_atf__exit_code);
        uVar1 = atf_is_error(tp_local);
        if ((uVar1 & 1) == 0) {
          tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_atf__signal);
          uVar1 = atf_is_error(tp_local);
          if ((uVar1 & 1) == 0) {
            tp_local = (atf_tp_t *)atf_no_error();
          }
        }
      }
    }
  }
  return (atf_error_t)tp_local;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, atf__environment);
	ATF_TP_ADD_TC(tp, atf__timeout);
	ATF_TP_ADD_TC(tp, atf__checkfail);
	ATF_TP_ADD_TC(tp, atf__exit_code);
	ATF_TP_ADD_TC(tp, atf__signal);

	return atf_no_error();
}